

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedChargeAdapter.cpp
# Opt level: O3

FixedChargeAtypeParameters __thiscall
OpenMD::FixedChargeAdapter::getFixedChargeParam(FixedChargeAdapter *this)

{
  bool bVar1;
  long lVar2;
  FixedChargeAtypeParameters FVar3;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_48 [16];
  string local_38;
  
  bVar1 = AtomType::hasProperty(this->at_,(string *)OpenMD::FCtypeID_abi_cxx11_);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_38,this->at_);
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam was passed an atomType (%s)\n\tthat does not appear to be a fixed charge atom.\n"
             ,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_48,(string *)this->at_);
  if ((_func_int **)local_48._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_38,this->at_);
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam could not find fixed charge\n\tparameters for atomType %s.\n"
             ,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) goto LAB_001d99c7;
  }
  else {
LAB_001d99c7:
    lVar2 = __dynamic_cast(local_48._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::FixedChargeAtypeParameters>::typeinfo,0);
    if (lVar2 != 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        FVar3.charge = *(RealType *)(lVar2 + 0x28);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        }
        FVar3.charge = *(RealType *)(lVar2 + 0x28);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
      goto LAB_001d9a87;
    }
  }
  AtomType::getName_abi_cxx11_(&local_38,this->at_);
  snprintf(painCave.errMsg,2000,
           "FixedChargeAdapter::getFixedChargeParam could not convert\n\tGenericData to FixedChargeAtypeData for atom type %s\n"
           ,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  FVar3.charge = _DAT_00000028;
LAB_001d9a87:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return (FixedChargeAtypeParameters)FVar3.charge;
}

Assistant:

FixedChargeAtypeParameters FixedChargeAdapter::getFixedChargeParam() {
    if (!isFixedCharge()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a fixed charge atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FCtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not find fixed "
               "charge\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FixedChargeAtypeData> fcData =
        std::dynamic_pointer_cast<FixedChargeAtypeData>(data);
    if (fcData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not convert\n"
               "\tGenericData to FixedChargeAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return fcData->getData();
  }